

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
create_database(vector<const_char_*,_std::allocator<const_char_*>_> *databases)

{
  __uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  _Var1;
  long in_RDX;
  char **in_RSI;
  
  if (in_RDX - (long)in_RSI == 8) {
    _Var1._M_t.
    super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
    .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
         (tuple<Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>)
         Fossilize::create_database(*in_RSI,ReadOnly);
  }
  else {
    _Var1._M_t.
    super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
    .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
         (tuple<Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>)
         Fossilize::create_concurrent_database
                   ((char *)0x0,ReadOnly,in_RSI,in_RDX - (long)in_RSI >> 3);
  }
  (databases->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)_Var1._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  return (unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
          )_Var1._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<DatabaseInterface> create_database(const vector<const char *> &databases)
{
	unique_ptr<DatabaseInterface> resolver;
	if (databases.size() == 1)
	{
		resolver.reset(create_database(databases.front(), DatabaseMode::ReadOnly));
	}
	else
	{
		resolver.reset(create_concurrent_database(nullptr, DatabaseMode::ReadOnly,
		                                          databases.data(), databases.size()));
	}
	return resolver;
}